

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptAsyncGenerator.h
# Opt level: O2

AsyncGeneratorRequest * __thiscall
Js::JavascriptAsyncGenerator::PeekRequest(JavascriptAsyncGenerator *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  AsyncGeneratorRequest **ppAVar4;
  DList<Js::JavascriptAsyncGenerator::AsyncGeneratorRequest_*,_Memory::Recycler,_RealCount> *this_00
  ;
  
  this_00 = (this->requestQueue).ptr;
  if ((DList<Js::JavascriptAsyncGenerator::AsyncGeneratorRequest_*,_Memory::Recycler,_RealCount> *)
      (this_00->super_DListBase<Js::JavascriptAsyncGenerator::AsyncGeneratorRequest_*,_RealCount>).
      super_DListNodeBase<Js::JavascriptAsyncGenerator::AsyncGeneratorRequest_*>.next.base ==
      this_00) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptAsyncGenerator.h"
                                ,0x49,"(!requestQueue->Empty())","!requestQueue->Empty()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
    this_00 = (this->requestQueue).ptr;
  }
  ppAVar4 = DListBase<Js::JavascriptAsyncGenerator::AsyncGeneratorRequest_*,_RealCount>::Head
                      (&this_00->
                        super_DListBase<Js::JavascriptAsyncGenerator::AsyncGeneratorRequest_*,_RealCount>
                      );
  return *ppAVar4;
}

Assistant:

AsyncGeneratorRequest* PeekRequest()
    {
        Assert(!requestQueue->Empty());
        return requestQueue->Head();
    }